

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O3

int bgzf_check_EOF(BGZF *fp)

{
  hFILE *phVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char *__src;
  off_t oVar5;
  size_t __n;
  int *piVar6;
  uint uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint8_t buf [28];
  char cStack_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char local_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  char cStack_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  
  phVar1 = fp->fp;
  lVar2 = phVar1->offset;
  pcVar3 = phVar1->begin;
  pcVar4 = phVar1->buffer;
  oVar5 = hseek(phVar1,-0x1c,2);
  if (oVar5 < 0) {
    piVar6 = __errno_location();
    uVar7 = 0xffffffff;
    if (*piVar6 == 0x1d) {
      fp->fp->has_errno = 0;
      uVar7 = 2;
    }
  }
  else {
    phVar1 = fp->fp;
    __src = phVar1->begin;
    uVar8 = (long)phVar1->end - (long)__src;
    __n = 0x1c;
    if (uVar8 < 0x1c) {
      __n = uVar8;
    }
    memcpy(&cStack_58,__src,__n);
    phVar1->begin = __src + __n;
    if (uVar8 < 0x1c) {
      __n = hread2(phVar1,&cStack_58,0x1c,__n);
    }
    uVar7 = 0xffffffff;
    if (__n == 0x1c) {
      oVar5 = hseek(fp->fp,(off_t)(pcVar3 + (lVar2 - (long)pcVar4)),0);
      if (-1 < oVar5) {
        auVar9[0] = -(local_4c == 'B');
        auVar9[1] = -(cStack_4b == 'C');
        auVar9[2] = -(cStack_4a == '\x02');
        auVar9[3] = -(cStack_49 == '\0');
        auVar9[4] = -(cStack_48 == '\x1b');
        auVar9[5] = -(cStack_47 == '\0');
        auVar9[6] = -(cStack_46 == '\x03');
        auVar9[7] = -(cStack_45 == '\0');
        auVar9[8] = -(cStack_44 == '\0');
        auVar9[9] = -(cStack_43 == '\0');
        auVar9[10] = -(cStack_42 == '\0');
        auVar9[0xb] = -(cStack_41 == '\0');
        auVar9[0xc] = -(cStack_40 == '\0');
        auVar9[0xd] = -(cStack_3f == '\0');
        auVar9[0xe] = -(cStack_3e == '\0');
        auVar9[0xf] = -(cStack_3d == '\0');
        auVar10[0] = -(cStack_58 == '\x1f');
        auVar10[1] = -(cStack_57 == -0x75);
        auVar10[2] = -(cStack_56 == '\b');
        auVar10[3] = -(cStack_55 == '\x04');
        auVar10[4] = -(cStack_54 == '\0');
        auVar10[5] = -(cStack_53 == '\0');
        auVar10[6] = -(cStack_52 == '\0');
        auVar10[7] = -(cStack_51 == '\0');
        auVar10[8] = -(cStack_50 == '\0');
        auVar10[9] = -(cStack_4f == -1);
        auVar10[10] = -(cStack_4e == '\x06');
        auVar10[0xb] = -(cStack_4d == '\0');
        auVar10[0xc] = -(local_4c == 'B');
        auVar10[0xd] = -(cStack_4b == 'C');
        auVar10[0xe] = -(cStack_4a == '\x02');
        auVar10[0xf] = -(cStack_49 == '\0');
        auVar10 = auVar10 & auVar9;
        uVar7 = (uint)((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                               (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff);
      }
    }
  }
  return uVar7;
}

Assistant:

int bgzf_check_EOF(BGZF *fp)
{
    uint8_t buf[28];
    off_t offset = htell(fp->fp);
    if (hseek(fp->fp, -28, SEEK_END) < 0) {
        if (errno == ESPIPE) { hclearerr(fp->fp); return 2; }
        else return -1;
    }
    if ( hread(fp->fp, buf, 28) != 28 ) return -1;
    if ( hseek(fp->fp, offset, SEEK_SET) < 0 ) return -1;
    return (memcmp("\037\213\010\4\0\0\0\0\0\377\6\0\102\103\2\0\033\0\3\0\0\0\0\0\0\0\0\0", buf, 28) == 0)? 1 : 0;
}